

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O1

int8_t icu_63::compareUnicodeString(UElement t1,UElement t2)

{
  short sVar1;
  ushort uVar2;
  int8_t iVar3;
  UChar *srcChars;
  int iVar4;
  int32_t length;
  UnicodeString *b;
  int srcStart;
  int srcLength;
  
  sVar1 = *(short *)((long)t1.pointer + 8);
  uVar2 = *(ushort *)((long)t2.pointer + 8);
  if ((uVar2 & 1) == 0) {
    if ((short)uVar2 < 0) {
      iVar4 = *(int *)((long)t2.pointer + 0xc);
    }
    else {
      iVar4 = (int)(short)uVar2 >> 5;
    }
    srcStart = 0;
    if (iVar4 < 0) {
      srcStart = iVar4;
    }
    srcLength = iVar4 - srcStart;
    if (iVar4 <= iVar4 - srcStart) {
      srcLength = iVar4;
    }
    if (iVar4 < 0) {
      srcLength = 0;
    }
    if (sVar1 < 0) {
      length = *(int32_t *)((long)t1.pointer + 0xc);
    }
    else {
      length = (int)sVar1 >> 5;
    }
    if ((uVar2 & 2) == 0) {
      srcChars = *(UChar **)((long)t2.pointer + 0x18);
    }
    else {
      srcChars = (UChar *)((long)t2.pointer + 10);
    }
    iVar3 = UnicodeString::doCompare
                      ((UnicodeString *)t1.pointer,0,length,srcChars,srcStart,srcLength);
    return iVar3;
  }
  return ~(byte)sVar1 & 1;
}

Assistant:

static int8_t U_CALLCONV compareUnicodeString(UElement t1, UElement t2) {
    const UnicodeString &a = *(const UnicodeString*)t1.pointer;
    const UnicodeString &b = *(const UnicodeString*)t2.pointer;
    return a.compare(b);
}